

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * operator+=(QString *a,QStringBuilder<const_QString_&,_const_QLatin1Char_&> *b)

{
  ArrayOptions *pAVar1;
  char16_t *__dest;
  ulong alloc;
  Data *pDVar2;
  long lVar3;
  ulong alloc_00;
  char16_t *pcVar4;
  long lVar5;
  ulong uVar6;
  
  pDVar2 = (a->d).d;
  alloc_00 = (a->d).size;
  uVar6 = alloc_00 + (b->a->d).size + 1;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData(a,alloc_00,KeepSize);
    pDVar2 = (a->d).d;
    alloc_00 = (a->d).size;
    alloc = uVar6;
    if (pDVar2 != (Data *)0x0) goto LAB_003d76bf;
LAB_003d7707:
    if (alloc < alloc_00) {
      alloc = alloc_00;
    }
    QString::reallocData(a,alloc,KeepSize);
    pDVar2 = (a->d).d;
    if (pDVar2 != (Data *)0x0) {
      lVar3 = (pDVar2->super_QArrayData).alloc;
LAB_003d772a:
      if (lVar3 != 0) {
        pAVar1 = &(pDVar2->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
      goto LAB_003d7733;
    }
  }
  else {
LAB_003d76bf:
    lVar3 = (pDVar2->super_QArrayData).alloc;
    lVar5 = (long)((long)(a->d).ptr -
                  ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1
    ;
    if ((long)((lVar3 - alloc_00) - lVar5) < (long)uVar6) {
      alloc = lVar3 * 2;
      if (lVar3 * 2 < (long)uVar6) {
        alloc = uVar6;
      }
      if ((1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar3 - lVar5 <= (long)alloc)) goto LAB_003d7707;
      goto LAB_003d772a;
    }
LAB_003d7733:
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_003d774b;
  }
  QString::reallocData(a,(a->d).size,KeepSize);
LAB_003d774b:
  pcVar4 = (a->d).ptr;
  __dest = pcVar4 + (a->d).size;
  lVar3 = (b->a->d).size;
  if (lVar3 != 0) {
    pcVar4 = (b->a->d).ptr;
    if (pcVar4 == (char16_t *)0x0) {
      pcVar4 = &QString::_empty;
    }
    memcpy(__dest,pcVar4,lVar3 * 2);
    pcVar4 = (a->d).ptr;
  }
  __dest[lVar3] = (ushort)(byte)b->b->ch;
  if (pcVar4 == (char16_t *)0x0) {
    pcVar4 = &QString::_empty;
  }
  QString::resize(a,(long)(__dest + lVar3) + (2 - (long)pcVar4) >> 1);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}